

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O1

vector __thiscall sisl::utility::ppm_image::calc_minmax(ppm_image *this)

{
  DenseStorage<double,__1,__1,_1,_0> *other;
  Index extraout_RDX;
  uint d0;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RSI;
  uint uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  vector vVar5;
  double max;
  vector data;
  double *local_58;
  double *local_50;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  
  (this->m_aArray)._array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  (this->m_aArray)._dims[0] = 0;
  (this->m_aArray)._dims[1] = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,2,2,1);
  local_58 = (double *)0xfff0000000000000;
  if (*(int *)((long)&in_RSI[1]._array + 4) < 1) {
    local_50 = (double *)0x7ff0000000000000;
  }
  else {
    local_50 = (double *)0x7ff0000000000000;
    d0 = 0;
    do {
      if (0 < *(int *)&in_RSI[1]._array) {
        uVar2 = 0;
        do {
          other = (DenseStorage<double,__1,__1,_1,_0> *)
                  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator()(in_RSI,d0,uVar2);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,other);
          if (((local_48.m_row < 1) || (local_48.m_row == 1)) || (local_48.m_row < 3)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar3 = ((local_48.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_data;
          if ((double)local_58 < (double)pdVar3) {
            local_58 = pdVar3;
          }
          pdVar4 = (double *)
                   ((local_48.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_rows;
          if ((double)local_58 < (double)pdVar4) {
            local_58 = pdVar4;
          }
          pdVar4 = local_48.m_xpr[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          if ((double)local_58 < (double)pdVar4) {
            local_58 = pdVar4;
          }
          if ((double)local_50 <= (double)pdVar3) {
            pdVar3 = local_50;
          }
          pdVar4 = (double *)
                   ((local_48.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_rows;
          if ((double)pdVar3 <= (double)pdVar4) {
            pdVar4 = pdVar3;
          }
          local_50 = local_48.m_xpr[1].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          if ((double)pdVar4 <= (double)local_50) {
            local_50 = pdVar4;
          }
          free(local_48.m_xpr);
          uVar1 = (int)uVar2 + 1;
          uVar2 = (ulong)uVar1;
        } while ((int)uVar1 < *(int *)&in_RSI[1]._array);
      }
      d0 = d0 + 1;
    } while ((int)d0 < *(int *)((long)&in_RSI[1]._array + 4));
  }
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  local_48.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  if (*(long *)(this->m_aArray)._dims < 1) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  (((this->m_aArray)._array)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
  m_storage.m_data = local_50;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (&local_48,(Scalar *)&local_58);
  if ((local_48.m_currentBlockRows + local_48.m_row ==
       *(long *)((array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&(local_48.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)->_dims) &&
     (local_48.m_col == 1)) {
    vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (vector)vVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

vector calc_minmax(){
                using namespace std;
                vector ret(2);
                double min = std::numeric_limits<double>::infinity();
                double max = -std::numeric_limits<double>::infinity();

                for(int i = 0; i < m_iWidth; i++) {
                    for(int j = 0; j < m_iHeight; j++) {
                        vector data = m_aArray(i,j);
                        if(data[0] < min) min = data[0];
                        if(data[1] < min) min = data[1];
                        if(data[2] < min) min = data[2];
                        if(data[0] > max) max = data[0];
                        if(data[1] > max) max = data[1];
                        if(data[2] > max) max = data[2];
                    }
                }
                ret << min, max;
                return ret;
            }